

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

void __thiscall
HighsCliqueTable::buildFrom(HighsCliqueTable *this,HighsLp *origModel,HighsCliqueTable *init)

{
  int iVar1;
  pointer pCVar2;
  pointer pCVar3;
  pointer pCVar4;
  pointer pCVar5;
  bool bVar6;
  ulong uVar7;
  const_iterator cVar8;
  ulong uVar9;
  long lVar10;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var11;
  long lVar12;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  __it;
  const_iterator __first;
  _Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:2332:36)>
  local_260;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> clqBuffer;
  _Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:2332:36)>
  local_220;
  HighsCliqueTable local_218;
  
  HighsCliqueTable(&local_218,
                   (HighsInt)
                   ((ulong)((long)(init->colsubstituted).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(init->colsubstituted).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2));
  local_218.inPresolve = this->minEntriesForParallelism != 0;
  pCVar2 = (init->cliques).
           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pCVar3 = (init->cliques).
           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  clqBuffer.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clqBuffer.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  clqBuffer.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::reserve
            (&clqBuffer,(long)origModel->num_col_ * 2);
  uVar7 = 0;
  do {
    if (uVar7 == (((long)pCVar3 - (long)pCVar2) / 0x14 & 0xffffffffU)) {
      std::vector<int,_std::allocator<int>_>::operator=
                (&local_218.colsubstituted,&init->colsubstituted);
      std::vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>::
      operator=(&local_218.substitutions,&init->substitutions);
      operator=(this,&local_218);
      std::_Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
      ~_Vector_base(&clqBuffer.
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   );
      ~HighsCliqueTable(&local_218);
      return;
    }
    pCVar4 = (init->cliques).
             super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar1 = pCVar4[uVar7].start;
    if (((long)iVar1 != -1) && (1 < pCVar4[uVar7].end - (pCVar4[uVar7].numZeroFixed + iVar1))) {
      pCVar5 = (init->cliqueentries).
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>>
                ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>> *)
                 &clqBuffer,pCVar5 + iVar1,pCVar5 + pCVar4[uVar7].end);
      pCVar5 = clqBuffer.
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar10 = (long)clqBuffer.
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)clqBuffer.
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      __it._M_current =
           clqBuffer.
           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_260._M_pred.origModel =
           (anon_class_8_1_082d2408_for__M_pred)(anon_class_8_1_082d2408_for__M_pred)origModel;
      local_220._M_pred.origModel =
           (anon_class_8_1_082d2408_for__M_pred)(anon_class_8_1_082d2408_for__M_pred)origModel;
      for (lVar12 = lVar10 >> 4; cVar8._M_current = pCVar5, _Var11._M_current = __it._M_current,
          0 < lVar12; lVar12 = lVar12 + -1) {
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<HighsCliqueTable::buildFrom(HighsLp_const*,HighsCliqueTable_const&)::$_0>
                ::operator()(&local_260,__it);
        if (bVar6) goto LAB_0027b28c;
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<HighsCliqueTable::buildFrom(HighsLp_const*,HighsCliqueTable_const&)::$_0>
                ::operator()(&local_260,__it._M_current + 1);
        _Var11._M_current = __it._M_current + 1;
        if (bVar6) goto LAB_0027b28c;
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<HighsCliqueTable::buildFrom(HighsLp_const*,HighsCliqueTable_const&)::$_0>
                ::operator()(&local_260,__it._M_current + 2);
        _Var11._M_current = __it._M_current + 2;
        if (bVar6) goto LAB_0027b28c;
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<HighsCliqueTable::buildFrom(HighsLp_const*,HighsCliqueTable_const&)::$_0>
                ::operator()(&local_260,__it._M_current + 3);
        _Var11._M_current = __it._M_current + 3;
        if (bVar6) goto LAB_0027b28c;
        __it._M_current = __it._M_current + 4;
        lVar10 = lVar10 + -0x10;
      }
      lVar10 = lVar10 >> 2;
      if (lVar10 == 1) {
LAB_0027b35e:
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<HighsCliqueTable::buildFrom(HighsLp_const*,HighsCliqueTable_const&)::$_0>
                ::operator()(&local_260,__it);
        _Var11._M_current = __it._M_current;
        if (!bVar6) {
          _Var11._M_current = pCVar5;
        }
LAB_0027b28c:
        __first._M_current = _Var11._M_current;
        if (_Var11._M_current != pCVar5) {
          while (_Var11._M_current = _Var11._M_current + 1,
                cVar8._M_current =
                     clqBuffer.
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_finish, _Var11._M_current != pCVar5) {
            bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<HighsCliqueTable::buildFrom(HighsLp_const*,HighsCliqueTable_const&)::$_0>
                    ::operator()(&local_220,_Var11);
            if (!bVar6) {
              *__first._M_current = *_Var11._M_current;
              __first._M_current = __first._M_current + 1;
            }
          }
        }
      }
      else {
        if (lVar10 == 2) {
LAB_0027b32c:
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<HighsCliqueTable::buildFrom(HighsLp_const*,HighsCliqueTable_const&)::$_0>
                  ::operator()(&local_260,_Var11);
          if (!bVar6) {
            __it._M_current = _Var11._M_current + 1;
            goto LAB_0027b35e;
          }
          goto LAB_0027b28c;
        }
        __first._M_current = pCVar5;
        if (lVar10 == 3) {
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<HighsCliqueTable::buildFrom(HighsLp_const*,HighsCliqueTable_const&)::$_0>
                  ::operator()(&local_260,__it);
          if (!bVar6) {
            _Var11._M_current = __it._M_current + 1;
            goto LAB_0027b32c;
          }
          goto LAB_0027b28c;
        }
      }
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::erase
                (&clqBuffer,__first,cVar8);
      uVar9 = (long)clqBuffer.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)clqBuffer.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2;
      if (1 < uVar9) {
        doAddClique(&local_218,
                    clqBuffer.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_start,(HighsInt)uVar9,false,
                    (uint)((init->cliques).
                           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar7].origin != 0x7fffffff) <<
                    0x1f | 0x7fffffff);
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void HighsCliqueTable::buildFrom(const HighsLp* origModel,
                                 const HighsCliqueTable& init) {
  assert(init.colsubstituted.size() == colsubstituted.size());
  HighsInt ncols = init.colsubstituted.size();
  HighsCliqueTable newCliqueTable(ncols);
  newCliqueTable.setPresolveFlag(inPresolve);
  newCliqueTable.setPresolveFlag(minEntriesForParallelism);
  HighsInt ncliques = init.cliques.size();
  std::vector<CliqueVar> clqBuffer;
  clqBuffer.reserve(2 * static_cast<size_t>(origModel->num_col_));
  for (HighsInt i = 0; i != ncliques; ++i) {
    if (init.cliques[i].start == -1) continue;

    HighsInt numvars = init.cliques[i].end - init.cliques[i].start;

    if (numvars - init.cliques[i].numZeroFixed <= 1) continue;

    clqBuffer.assign(init.cliqueentries.begin() + init.cliques[i].start,
                     init.cliqueentries.begin() + init.cliques[i].end);
    clqBuffer.erase(std::remove_if(clqBuffer.begin(), clqBuffer.end(),
                                   [origModel](CliqueVar v) {
                                     return origModel->col_lower_[v.col] !=
                                                0.0 ||
                                            origModel->col_upper_[v.col] != 1.0;
                                   }),
                    clqBuffer.end());
    if (clqBuffer.size() <= 1) continue;

    HighsInt origin = init.cliques[i].origin != kHighsIInf ? -1 : kHighsIInf;
    newCliqueTable.doAddClique(clqBuffer.data(), clqBuffer.size(), false,
                               origin);
  }

  newCliqueTable.colsubstituted = init.colsubstituted;
  newCliqueTable.substitutions = init.substitutions;
  *this = std::move(newCliqueTable);
}